

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# client.c
# Opt level: O0

int lws_set_proxy(lws_vhost *vhost,char *proxy)

{
  int iVar1;
  uint uVar2;
  char *pcVar3;
  char *p;
  char local_88 [4];
  int brackets;
  char authstring [96];
  char *local_20;
  char *proxy_local;
  lws_vhost *vhost_local;
  
  if (proxy == (char *)0x0) {
    return -1;
  }
  iVar1 = strncmp(proxy,"http://",7);
  local_20 = proxy;
  if (iVar1 == 0) {
    local_20 = proxy + 7;
  }
  pcVar3 = strrchr(local_20,0x40);
  if (pcVar3 == (char *)0x0) {
    vhost->proxy_basic_auth_token[0] = '\0';
LAB_00133f3a:
    lws_strncpy((vhost->http).http_proxy_address,local_20,0x80);
    pcVar3 = strchr((vhost->http).http_proxy_address,0x3a);
    if ((pcVar3 == (char *)0x0) && ((vhost->http).http_proxy_port == 0)) {
      _lws_log(1,"http_proxy needs to be ads:port\n");
      vhost_local._4_4_ = -1;
    }
    else {
      if (pcVar3 != (char *)0x0) {
        *pcVar3 = '\0';
        uVar2 = atoi(pcVar3 + 1);
        (vhost->http).http_proxy_port = uVar2;
      }
      _lws_log(8," Proxy %s:%u\n",&vhost->http,(ulong)(vhost->http).http_proxy_port);
      vhost_local._4_4_ = 0;
    }
  }
  else {
    if ((uint)((int)pcVar3 - (int)local_20) < 0x60) {
      lws_strncpy(local_88,local_20,(size_t)(pcVar3 + (1 - (long)local_20)));
      iVar1 = lws_b64_encode_string
                        (local_88,(int)pcVar3 - (int)local_20,vhost->proxy_basic_auth_token,0x80);
      if (-1 < iVar1) {
        _lws_log(8," Proxy auth in use\n");
        local_20 = pcVar3 + 1;
        goto LAB_00133f3a;
      }
    }
    _lws_log(1,"proxy auth too long\n");
    vhost_local._4_4_ = -1;
  }
  return vhost_local._4_4_;
}

Assistant:

int
lws_set_proxy(struct lws_vhost *vhost, const char *proxy)
{
	char authstring[96];
	int brackets = 0;
	char *p;

	if (!proxy)
		return -1;

	/* we have to deal with a possible redundant leading http:// */
	if (!strncmp(proxy, "http://", 7))
		proxy += 7;

	p = strrchr(proxy, '@');
	if (p) { /* auth is around */

		if ((unsigned int)(p - proxy) > sizeof(authstring) - 1)
			goto auth_too_long;

		lws_strncpy(authstring, proxy, p - proxy + 1);
		// null termination not needed on input
		if (lws_b64_encode_string(authstring, lws_ptr_diff(p, proxy),
				vhost->proxy_basic_auth_token,
		    sizeof vhost->proxy_basic_auth_token) < 0)
			goto auth_too_long;

		lwsl_info(" Proxy auth in use\n");

#if defined(LWS_ROLE_H1) || defined(LWS_ROLE_H2)
		proxy = p + 1;
#endif
	} else
		vhost->proxy_basic_auth_token[0] = '\0';

#if defined(LWS_ROLE_H1) || defined(LWS_ROLE_H2)

#if defined(LWS_WITH_IPV6)
	/*
	 * isolating the address / port is complicated by IPv6 overloading
	 * the meaning of : in the address.  The convention to solve it is to
	 * put [] around the ipv6 address part, eg, "[::1]:443".  This must be
	 * parsed to "::1" as the address and the port as 443.
	 *
	 * IPv4 addresses like myproxy:443 continue to be parsed as normal.
	 */

	if (proxy[0] == '[')
		brackets = 1;
#endif

	lws_strncpy(vhost->http.http_proxy_address, proxy + brackets,
		    sizeof(vhost->http.http_proxy_address));

	p = vhost->http.http_proxy_address;

#if defined(LWS_WITH_IPV6)
	if (brackets) {
		/* original is IPv6 format "[::1]:443" */

		p = strchr(vhost->http.http_proxy_address, ']');
		if (!p) {
			lwsl_err("%s: malformed proxy '%s'\n", __func__, proxy);

			return -1;
		}
		*p++ = '\0';
	}
#endif

	p = strchr(p, ':');
	if (!p && !vhost->http.http_proxy_port) {
		lwsl_err("http_proxy needs to be ads:port\n");

		return -1;
	}
	if (p) {
		*p = '\0';
		vhost->http.http_proxy_port = atoi(p + 1);
	}

	lwsl_info(" Proxy %s:%u\n", vhost->http.http_proxy_address,
		  vhost->http.http_proxy_port);
#endif

	return 0;

auth_too_long:
	lwsl_err("proxy auth too long\n");

	return -1;
}